

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setInterfaceTag
          (CommonCore *this,InterfaceHandle handle,string_view tag,string_view value)

{
  shared_mutex *__rwlock;
  _Hash_node_base *p_Var1;
  size_type sVar2;
  int iVar3;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var4;
  BasicHandleInfo *this_00;
  InvalidIdentifier *this_01;
  pointer_____offset_0x10___ *ppuVar5;
  _Alloc_hider _Var6;
  string_view message;
  string_view message_00;
  string_view value_00;
  ActionMessage tagcmd;
  
  if ((setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
       ::trueString_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                                   ::trueString_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                ::trueString_abi_cxx11_,"true",(allocator<char> *)&tagcmd);
    __cxa_atexit(std::__cxx11::string::~string,
                 &setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                  ::trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                         ::trueString_abi_cxx11_);
  }
  if (tag._M_len == 0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "tag cannot be an empty string for setInterfaceTag";
    message._M_len = 0x31;
    InvalidParameter::InvalidParameter((InvalidParameter *)this_01,message);
    ppuVar5 = &InvalidParameter::typeinfo;
  }
  else {
    p_Var4 = getHandleInfo(this,handle);
    sVar2 = setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
            ::trueString_abi_cxx11_._M_string_length;
    _Var6 = setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
            ::trueString_abi_cxx11_._M_dataplus;
    if (p_Var4 != (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                   *)0x0) {
      __rwlock = &(this->handles).m_mutex;
      std::__shared_mutex_pthread::lock(&__rwlock->_M_impl);
      this_00 = HandleManager::getHandleInfo(&(this->handles).m_obj,handle.hid);
      if (value._M_len != 0) {
        _Var6._M_p = value._M_str;
        sVar2 = value._M_len;
      }
      value_00._M_str = _Var6._M_p;
      value_00._M_len = sVar2;
      BasicHandleInfo::setTag(this_00,tag,value_00);
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      ActionMessage::ActionMessage(&tagcmd,cmd_interface_tag);
      p_Var1 = (p_Var4->super__Hash_node_base)._M_nxt;
      tagcmd.source_id.gid = (BaseType)p_Var1;
      tagcmd.source_handle.hid = (BaseType)((ulong)p_Var1 >> 0x20);
      tagcmd.dest_id.gid = tagcmd.source_id.gid;
      tagcmd.dest_handle.hid = tagcmd.source_handle.hid;
      ActionMessage::setStringData(&tagcmd,tag,value);
      BrokerBase::addActionMessage(&this->super_BrokerBase,&tagcmd);
      ActionMessage::~ActionMessage(&tagcmd);
      return;
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message_00._M_str = "the handle specifier for setInterfaceTag is not valid";
    message_00._M_len = 0x35;
    InvalidIdentifier::InvalidIdentifier(this_01,message_00);
    ppuVar5 = &InvalidIdentifier::typeinfo;
  }
  __cxa_throw(this_01,ppuVar5,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setInterfaceTag(helics::InterfaceHandle handle,
                                 std::string_view tag,
                                 std::string_view value)
{
    static const std::string trueString{"true"};
    if (tag.empty()) {
        throw InvalidParameter("tag cannot be an empty string for setInterfaceTag");
    }
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw InvalidIdentifier("the handle specifier for setInterfaceTag is not valid");
        return;
    }

    std::string_view valueStr{value.empty() ? trueString : value};

    handles.modify(
        [&](auto& hdls) { hdls.getHandleInfo(handle.baseValue())->setTag(tag, valueStr); });

    if (handleInfo != nullptr) {
        ActionMessage tagcmd(CMD_INTERFACE_TAG);
        tagcmd.setSource(handleInfo->handle);
        tagcmd.setDestination(handleInfo->handle);
        tagcmd.setStringData(tag, value);
        addActionMessage(std::move(tagcmd));
    }
}